

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warrior.c
# Opt level: O2

void do_exchange(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  CHAR_DATA *ch_00;
  float fVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  CClass *this;
  char *txt;
  long lVar6;
  float fVar7;
  
  iVar4 = get_skill(ch,(int)gsn_exchange);
  if (iVar4 != 0) {
    sVar1 = ch->level;
    lVar6 = (long)gsn_exchange;
    this = char_data::Class(ch);
    iVar5 = CClass::GetIndex(this);
    if ((*(short *)(lVar6 * 0x60 + 0x4ab788 + (long)iVar5 * 2) <= sVar1) ||
       (bVar3 = is_npc(ch), bVar3)) {
      if (ch->fighting == (CHAR_DATA *)0x0) {
        txt = "You must be fighting to exchange blows!\n\r";
      }
      else {
        bVar3 = is_wielded(ch,3,3);
        if (((bVar3) || (bVar3 = is_wielded(ch,9,3), bVar3)) || (bVar3 = is_wielded(ch,8,3), bVar3))
        {
          txt = "Your weapon is ineffective in close quarters.";
        }
        else {
          ch_00 = ch->fighting;
          if (ch_00 == (CHAR_DATA *)0x0) {
            txt = "Who are you trying to exchange blows with?\n\r";
          }
          else {
            if (ch_00 != ch) {
              fVar2 = (float)iVar4 * 0.9;
              if (30.0 <= fVar2) {
                fVar7 = 90.0;
                if (fVar2 <= 90.0) {
                  fVar7 = fVar2;
                }
              }
              else {
                fVar7 = 30.0;
              }
              iVar5 = average_ac(ch);
              iVar4 = 0x32;
              if (iVar5 / 5 < 0x32) {
                iVar4 = iVar5 / 5;
              }
              act("Ignoring $N\'s onslaught, you close the ground between you and strike!",ch,
                  (void *)0x0,ch_00,3);
              act("Ignoring your onslaught, $n closes the ground between you and strikes!",ch,
                  (void *)0x0,ch_00,2);
              act("Ignoring $N\'s onslaught, $n closes the ground between them and strikes!",ch,
                  (void *)0x0,ch_00,1);
              one_hit_new(ch_00,ch,-1,false,false,0,100 - iVar4,(char *)0x0);
              iVar4 = number_percent();
              iVar5 = 200;
              if (fVar7 <= (float)iVar4) {
                iVar5 = 0;
              }
              one_hit_new(ch,ch_00,-1,false,false,0,iVar5,(char *)0x0);
              check_improve(ch,(int)gsn_exchange,(float)iVar4 < fVar7,1);
              WAIT_STATE(ch,0x18);
              return;
            }
            txt = "You really don\'t want to hit yourself.\n\r";
          }
        }
      }
      goto LAB_003783c1;
    }
  }
  txt = "You don\'t know how to do that.\n\r";
LAB_003783c1:
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_exchange(CHAR_DATA *ch, char *argument)
{
	CHAR_DATA *victim;
	int AC;
	float chance = get_skill(ch, gsn_exchange);

	if ((chance == 0) || (ch->level < skill_table[gsn_exchange].skill_level[ch->Class()->GetIndex()] && !is_npc(ch)))
	{
		send_to_char("You don't know how to do that.\n\r", ch);
		return;
	}

	if (!ch->fighting)
	{
		send_to_char("You must be fighting to exchange blows!\n\r", ch);
		return;
	}

	if (is_wielded(ch, WEAPON_SPEAR, WIELD_PRIMARY)
		|| is_wielded(ch, WEAPON_STAFF, WIELD_PRIMARY)
		|| is_wielded(ch, WEAPON_POLEARM, WIELD_PRIMARY))
	{
		send_to_char("Your weapon is ineffective in close quarters.", ch);
		return;
	}

	victim = ch->fighting;

	if (victim == nullptr)
	{
		send_to_char("Who are you trying to exchange blows with?\n\r", ch);
		return;
	}

	if (victim == ch)
	{
		send_to_char("You really don't want to hit yourself.\n\r", ch);
		return;
	}

	chance = URANGE(30, chance * .9, 90);
	AC = average_ac(ch) / 5;

	if (AC > 50)
		AC = 50;

	AC = 100 - AC;

	act("Ignoring $N's onslaught, you close the ground between you and strike!", ch, 0, victim, TO_CHAR);
	act("Ignoring your onslaught, $n closes the ground between you and strikes!", ch, 0, victim, TO_VICT);
	act("Ignoring $N's onslaught, $n closes the ground between them and strikes!", ch, 0, victim, TO_NOTVICT);

	one_hit_new(victim, ch, TYPE_UNDEFINED, HIT_NOSPECIALS, HIT_UNBLOCKABLE, HIT_NOADD, AC, nullptr);

	if (number_percent() < chance)
	{
		one_hit_new(ch, victim, TYPE_UNDEFINED, HIT_NOSPECIALS, HIT_UNBLOCKABLE, HIT_NOADD, 200, nullptr);
		check_improve(ch, gsn_exchange, true, 1);
	}
	else
	{
		one_hit_new(ch, victim, TYPE_UNDEFINED, HIT_NOSPECIALS, HIT_UNBLOCKABLE, HIT_NOADD, 0, nullptr);
		check_improve(ch, gsn_exchange, false, 1);
	}

	WAIT_STATE(ch, 2 * PULSE_VIOLENCE);
}